

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuccessAfterDecorator.hpp
# Opt level: O0

Status __thiscall
AO::BehaviorTree::Version_1::Details::SuccessAfterDecorator<Agent,_short>::filter
          (SuccessAfterDecorator<Agent,_short> *this,EntityPtr entity,short args)

{
  bool bVar1;
  int iVar2;
  __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var3;
  element_type *peVar4;
  Status status_1;
  Status status;
  short args_local;
  EntityPtr entity_local;
  SuccessAfterDecorator<Agent,_short> *this_local;
  
  if (this->count == 0) {
    bVar1 = std::
            vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
            ::empty(&(this->super_DecoratorNode<Agent,_short>).super_CompositeNode<Agent,_short>.
                     children);
    if (!bVar1) {
      p_Var3 = (__shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::
                  vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
                  ::front(&(this->super_DecoratorNode<Agent,_short>).
                           super_CompositeNode<Agent,_short>.children);
      peVar4 = std::
               __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var3);
      iVar2 = (*(peVar4->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                        (peVar4,entity,(ulong)(uint)(int)args);
      if (((char)iVar2 == '\0') || ((char)iVar2 == '\x01')) {
        p_Var3 = (__shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::
                    vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
                    ::front(&(this->super_DecoratorNode<Agent,_short>).
                             super_CompositeNode<Agent,_short>.children);
        peVar4 = std::
                 __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var3);
        (*(peVar4->super_RootNode<Agent,_short>)._vptr_RootNode[2])(peVar4,entity);
      }
    }
    this_local._7_1_ = Success;
  }
  else {
    this->count = this->count - 1;
    bVar1 = std::
            vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
            ::empty(&(this->super_DecoratorNode<Agent,_short>).super_CompositeNode<Agent,_short>.
                     children);
    if (bVar1) {
      this_local._7_1_ = Running;
    }
    else {
      p_Var3 = (__shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::
                  vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
                  ::front(&(this->super_DecoratorNode<Agent,_short>).
                           super_CompositeNode<Agent,_short>.children);
      peVar4 = std::
               __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var3);
      iVar2 = (*(peVar4->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                        (peVar4,entity,(ulong)(uint)(int)args);
      this_local._7_1_ = (Status)iVar2;
      if ((this_local._7_1_ == Success) || (this_local._7_1_ == Failure)) {
        p_Var3 = (__shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::
                    vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
                    ::front(&(this->super_DecoratorNode<Agent,_short>).
                             super_CompositeNode<Agent,_short>.children);
        peVar4 = std::
                 __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var3);
        (*(peVar4->super_RootNode<Agent,_short>)._vptr_RootNode[2])(peVar4,entity);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

Status filter(EntityPtr entity, Args... args) override final
					{
						if (count == 0)
						{
							if (!this->children.empty())
							{
								Status const status = this->children.front()->execute(entity, args...);
								if (status == Status::Success || status == Status::Failure)
								{
									this->children.front()->initialize(entity);
								}
							}
							return Status::Success;
						}
						else
						{
							--count;
							if (!this->children.empty())
							{
								Status const status = this->children.front()->execute(entity, args...);
								if (status == Status::Success || status == Status::Failure)
								{
									this->children.front()->initialize(entity);
								}
								return status;
							}
							return Status::Running;
						}
					}